

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

int av1_get_adaptive_rdmult(AV1_COMP *cpi,double beta)

{
  int iVar1;
  long *in_RDI;
  double in_XMM0_Qa;
  int qindex_rdmult;
  FRAME_TYPE frame_type;
  int layer_depth;
  int boost_index;
  GF_GROUP *gf_group;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  FRAME_TYPE in_stack_ffffffffffffffa3;
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  aom_tune_metric aVar2;
  aom_bit_depth_t bit_depth;
  undefined3 in_stack_ffffffffffffffb4;
  int qindex;
  undefined3 in_stack_ffffffffffffffc0;
  int use_fixed_qp_offsets;
  aom_tune_metric tuning;
  
  if (*(int *)(*in_RDI + 0x480 + (ulong)*(byte *)(in_RDI + 0xe258) * 4) < 6) {
    iVar1 = *(int *)(*in_RDI + 0x480 + (ulong)*(byte *)(in_RDI + 0xe258) * 4);
  }
  else {
    iVar1 = 6;
  }
  aVar2 = *(aom_tune_metric *)(in_RDI + 0x783d);
  bit_depth = *(aom_bit_depth_t *)(in_RDI[0x8401] + 0x48);
  qindex = CONCAT13(*(undefined1 *)(*in_RDI + 400 + (ulong)*(byte *)(in_RDI + 0xe258)),
                    in_stack_ffffffffffffffb4);
  use_fixed_qp_offsets = CONCAT13((char)in_RDI[0x77f0],in_stack_ffffffffffffffc0);
  tuning = aVar2;
  is_stat_consumption_stage
            ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  iVar1 = av1_compute_rd_mult(qindex,bit_depth,(FRAME_UPDATE_TYPE)(aVar2 >> 0x18),
                              in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                              in_stack_ffffffffffffffa3,use_fixed_qp_offsets,iVar1,tuning);
  return (int)((double)iVar1 / in_XMM0_Qa);
}

Assistant:

int av1_get_adaptive_rdmult(const AV1_COMP *cpi, double beta) {
  assert(beta > 0.0);
  const AV1_COMMON *cm = &cpi->common;

  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const int boost_index = AOMMIN(15, (cpi->ppi->p_rc.gfu_boost / 100));
  const int layer_depth = AOMMIN(gf_group->layer_depth[cpi->gf_frame_index], 6);
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;

  const int qindex_rdmult = cm->quant_params.base_qindex;
  return (int)(av1_compute_rd_mult(
                   qindex_rdmult, cm->seq_params->bit_depth,
                   cpi->ppi->gf_group.update_type[cpi->gf_frame_index],
                   layer_depth, boost_index, frame_type,
                   cpi->oxcf.q_cfg.use_fixed_qp_offsets,
                   is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning) /
               beta);
}